

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cc
# Opt level: O3

void __thiscall
gss::innards::Proof::finish_hom_clique_proof(Proof *this,NamedVertex *p,NamedVertex *t,uint size)

{
  unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  uVar1;
  _Head_base<0UL,_gss::innards::Proof::Imp_*,_false> _Var2;
  ostream *poVar3;
  mapped_type *pmVar4;
  key_type local_40;
  
  uVar1._M_t.
  super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>._M_head_impl =
       (((this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->proof_stream)._M_t
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             uVar1._M_t.
             super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
             .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
             _M_head_impl,"* end clique of size ",0x15);
  poVar3 = std::ostream::_M_insert<unsigned_long>
                     ((ulong)uVar1._M_t.
                             super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                             ._M_head_impl);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," around neighbourhood of ",0x19);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(p->second)._M_dataplus._M_p,(p->second)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," but not ",9);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(t->second)._M_dataplus._M_p,(t->second)._M_string_length);
  local_40.first = CONCAT71(local_40.first._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_40,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             (((this->_imp)._M_t.
               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
               ._M_t.
               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->proof_stream
             )._M_t,"# 0\n",4);
  uVar1._M_t.
  super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>._M_head_impl =
       (((this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->proof_stream)._M_t
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             uVar1._M_t.
             super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
             .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
             _M_head_impl,"u 1 ~x",6);
  local_40.first = (long)p->first;
  local_40.second = (long)t->first;
  pmVar4 = std::
           map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&((this->_imp)._M_t.
                          super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                          .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                         variable_mappings,&local_40);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)
                      uVar1._M_t.
                      super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                      ._M_head_impl,(pmVar4->_M_dataplus)._M_p,pmVar4->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," >= 1 ;\n",8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             (((this->_imp)._M_t.
               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
               ._M_t.
               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->proof_stream
             )._M_t,"w 1\n",4);
  _Var2._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
  (_Var2._M_head_impl)->proof_line = (_Var2._M_head_impl)->proof_line + 1;
  (_Var2._M_head_impl)->doing_hom_colour_proof = false;
  std::_Rb_tree<$190334c7$>::clear
            (&((_Var2._M_head_impl)->clique_for_hom_non_edge_constraints)._M_t);
  return;
}

Assistant:

auto Proof::finish_hom_clique_proof(const NamedVertex & p, const NamedVertex & t, unsigned size) -> void
{
    *_imp->proof_stream << "* end clique of size " << size << " around neighbourhood of " << p.second << " but not " << t.second << '\n';
    *_imp->proof_stream << "# 0\n";
    *_imp->proof_stream << "u 1 ~x" << _imp->variable_mappings[pair{p.first, t.first}] << " >= 1 ;\n";
    *_imp->proof_stream << "w 1\n";
    ++_imp->proof_line;
    _imp->doing_hom_colour_proof = false;
    _imp->clique_for_hom_non_edge_constraints.clear();
}